

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  _Alloc_hider _Var1;
  long lVar2;
  undefined8 *puVar3;
  long *in_R8;
  char *__tmp;
  long in_FS_OFFSET;
  Table *table;
  RandomAccessFile *file;
  Slice key;
  string old_fname;
  string fname;
  char buf [8];
  Env *local_a8;
  Table *local_a0;
  RandomAccessFile *local_98;
  uint64_t *local_90;
  undefined8 local_88;
  string local_80;
  string local_60;
  uint64_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->env_ = (Env *)0x0;
  local_90 = &local_40;
  local_88 = 8;
  local_40 = file_size;
  lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))();
  *in_R8 = lVar2;
  if (lVar2 == 0) {
    TableFileName(&local_60,(string *)(file_number + 8),file_size);
    local_98 = (RandomAccessFile *)0x0;
    local_a0 = (Table *)0x0;
    (**(code **)(**(long **)file_number + 0x18))(&local_80,*(long **)file_number,&local_60);
    _Var1._M_p = local_80._M_dataplus._M_p;
    this->env_ = (Env *)local_80._M_dataplus._M_p;
    if ((Env *)local_80._M_dataplus._M_p != (Env *)0x0) {
      SSTTableFileName(&local_80,(string *)(file_number + 8),file_size);
      (**(code **)(**(long **)file_number + 0x18))
                (&local_a8,*(long **)file_number,&local_80,&local_98);
      if (local_a8 == (Env *)0x0) {
        this->env_ = (Env *)0x0;
        local_a8 = (Env *)_Var1._M_p;
      }
      operator_delete__(local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->env_ == (Env *)0x0) {
      Table::Open((Table *)&local_80,*(Options **)(file_number + 0x28),local_98,(uint64_t)handle,
                  &local_a0);
      this->env_ = (Env *)local_80._M_dataplus._M_p;
    }
    if (this->env_ == (Env *)0x0) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = local_98;
      puVar3[1] = local_a0;
      lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                        (*(long **)(file_number + 0x30),&local_90,puVar3,1,DeleteEntry);
      *in_R8 = lVar2;
    }
    else {
      if (local_a0 != (Table *)0x0) {
        __assert_fail("table == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/table_cache.cc"
                      ,0x40,
                      "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)")
        ;
      }
      if (local_98 != (RandomAccessFile *)0x0) {
        (*local_98->_vptr_RandomAccessFile[1])();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}